

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O1

void ArrayLiteral_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  uint uVar1;
  JsVm *pJVar2;
  char *__s;
  uint uVar3;
  int size;
  uint uVar4;
  JsLocation *pJVar5;
  undefined1 local_80 [8];
  JsValue expv;
  JsValue elv;
  JsValue v0;
  
  context->pc = na->location;
  pJVar2 = JsGetVm();
  if ((pJVar2->debug == 1) && (pJVar2 = JsGetVm(), pJVar2->trace != (JsVmTraceFn)0x0)) {
    pJVar2 = JsGetVm();
    (*pJVar2->trace)(context->engine,na->location,JS_TRACE_CALL);
  }
  JsFindValue((JsContext *)0x0,"Array",(JsValue *)((long)&elv.u + 8));
  JsAssert((uint)(v0._0_8_ != 0 &&
                 elv.u.completion.type == (JS_COMPLETION_THROW|JS_COMPLETION_BREAK)));
  (**(code **)(v0._0_8_ + 0x60))(v0._0_8_,0,0,0,res);
  context->pc = na->location;
  pJVar2 = JsGetVm();
  if ((pJVar2->debug == 1) && (pJVar2 = JsGetVm(), pJVar2->trace != (JsVmTraceFn)0x0)) {
    pJVar2 = JsGetVm();
    (*pJVar2->trace)(context->engine,na->location,JS_TRACE_RETURN);
  }
  elv.u.completion.type = JS_COMPLETION_RETURN;
  (*((res->u).object)->Put)((res->u).object,"length",(JsValue *)((long)&elv.u + 8),0);
  pJVar5 = na[1].location;
  if (pJVar5 != (JsLocation *)0x0) {
    res_00 = (JsValue *)((long)&expv.u + 8);
    uVar4 = 0;
    do {
      (*JsNodeClassEval[(*(JsAstNode **)&pJVar5->lineno)->astClass])
                (*(JsAstNode **)&pJVar5->lineno,context,(JsValue *)local_80);
      JsGetValue((JsValue *)local_80,res_00);
      size = 4;
      uVar1 = uVar4;
      if (uVar4 != 0) {
        do {
          uVar3 = uVar1 + 9;
          size = size + 1;
          uVar1 = (int)uVar1 / 10;
        } while (0x12 < uVar3);
      }
      __s = (char *)JsMalloc(size);
      sprintf(__s,"%d",(ulong)uVar4);
      (*((res->u).object)->Put)((res->u).object,__s,res_00,0);
      uVar4 = uVar4 + 1;
      pJVar5 = (JsLocation *)pJVar5[1].filename;
    } while (pJVar5 != (JsLocation *)0x0);
  }
  return;
}

Assistant:

static void
ArrayLiteral_eval(na, context, res)
	struct JsAstNode *na; /* (struct ArrayLiteral_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstArrayLiteralNode *n = CAST_NODE(na, JsAstArrayLiteralNode);
	struct JsAstArrayLiteralElement *element;
	struct JsValue expv, elv, v0;
	char *ind;
	struct JsObject* array;

	TRACE(na->location, context, JS_TRACE_CALL);
	//查询Array对象
	JsFindValue(NULL,"Array",&v0);
	//确定Array正确
	JsAssert(v0.type == JS_OBJECT && v0.u.object != NULL);
	array = v0.u.object;
	//构建空的Array
	(*array->Construct)(array,NULL,0,NULL,res);
	TRACE(na->location, context, JS_TRACE_RETURN);
	//配置length
	v0.type = JS_NUMBER;
	v0.u.number =  n->length;
	(*res->u.object->Put)(res->u.object,"length",&v0,JS_OBJECT_ATTR_DEFAULT);
	//加入数组元素
	int i;
	for (i=0,element = n->first; element; element = element->next , i++) {
		EVAL(element->expr, context, &expv);
		JsGetValue( &expv, &elv);
		//创建index string
		int bit = 0;
		int number = i;
		while(number){
			number /= 10;
			bit++;
		}
		ind = (char*)JsMalloc(bit+4);
		sprintf(ind,"%d",i);
		//添加到Array中
		(*res->u.object->Put)(res->u.object,ind,&elv,JS_OBJECT_ATTR_DEFAULT);
	}
}